

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# differentiable.cxx
# Opt level: O1

void __thiscall DifferentialEquation::prepareNextState(DifferentialEquation *this)

{
  prepareNextState((DifferentialEquation *)
                   ((long)&this[-1].super_StochasticVariable.super_StochasticProcess.
                           stochDescription.field_2 + 8));
  return;
}

Assistant:

void DifferentialEquation::prepareNextState()
{
	bool allStatesPrepared = true;
	for (int i=0; i<eqnTermAmount; ++i)
		allStatesPrepared = allStatesPrepared && (*eqnIntegrators[i]).isNextStatePrepared();
	
	if (allStatesPrepared) {
		(this->*eqnMethodPtr)();
		stochNextStateIsPrepared = true;
	}
	else
		stochNextStateIsPrepared = false;
}